

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::rr_e(CPU *this)

{
  CPU *this_local;
  
  rr_r8(this,&this->regs->e);
  return 2;
}

Assistant:

int CPU::rr_e() {
    rr_r8(regs.e);
    return 2;
}